

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLNodeLoader15.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL::NodeLoader15::begin__instance_camera
          (NodeLoader15 *this,instance_camera__AttributeData *attributeData)

{
  int iVar1;
  uint local_120 [2];
  URI local_118;
  undefined4 local_30;
  undefined4 uStack_2c;
  undefined4 uStack_28;
  undefined4 uStack_24;
  
  COLLADABU::URI::URI(&local_118);
  local_120[0] = 0;
  local_30 = *(undefined4 *)&attributeData->sid;
  uStack_2c = *(undefined4 *)((long)&attributeData->sid + 4);
  uStack_28 = *(undefined4 *)&attributeData->name;
  uStack_24 = *(undefined4 *)((long)&attributeData->name + 4);
  if ((attributeData->present_attributes & 1) != 0) {
    COLLADABU::URI::operator=(&local_118,&attributeData->url);
    local_120[0] = local_120[0] | 1;
  }
  iVar1 = (*(this->mLoader->super_HelperLoaderBase)._vptr_HelperLoaderBase[0x22])
                    (this->mLoader,local_120);
  COLLADABU::URI::~URI(&local_118);
  return SUB41(iVar1,0);
}

Assistant:

bool NodeLoader15::begin__instance_camera( const COLLADASaxFWL15::instance_camera__AttributeData& attributeData )
{
SaxVirtualFunctionTest15(begin__instance_camera(attributeData));
COLLADASaxFWL::instance_camera__AttributeData attrData;
attrData.present_attributes = 0;
attrData.sid = attributeData.sid;
attrData.name = attributeData.name;
if ( (attributeData.present_attributes & COLLADASaxFWL15::instance_camera__AttributeData::ATTRIBUTE_URL_PRESENT) == COLLADASaxFWL15::instance_camera__AttributeData::ATTRIBUTE_URL_PRESENT ) {
    attrData.url = attributeData.url;
    attrData.present_attributes |= COLLADASaxFWL::instance_camera__AttributeData::ATTRIBUTE_URL_PRESENT;
}
return mLoader->begin__instance_camera(attrData);
}